

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O3

AV1LoopfilterLevel __thiscall aom::AV1RateControlRTC::GetLoopfilterLevel(AV1RateControlRTC *this)

{
  AV1_COMP *pAVar1;
  AV1LoopfilterLevel AVar2;
  
  av1_pick_filter_level((YV12_BUFFER_CONFIG *)0x0,this->cpi_,'\x03');
  pAVar1 = this->cpi_;
  AVar2.filter_level[0] = (pAVar1->common).lf.filter_level[0];
  AVar2.filter_level[1] = (pAVar1->common).lf.filter_level[1];
  AVar2.filter_level_u = (pAVar1->common).lf.filter_level_u;
  AVar2.filter_level_v = (pAVar1->common).lf.filter_level_v;
  return AVar2;
}

Assistant:

AV1LoopfilterLevel AV1RateControlRTC::GetLoopfilterLevel() const {
  av1_pick_filter_level(nullptr, cpi_, LPF_PICK_FROM_Q);
  AV1LoopfilterLevel lpf_level;
  lpf_level.filter_level[0] = cpi_->common.lf.filter_level[0];
  lpf_level.filter_level[1] = cpi_->common.lf.filter_level[1];
  lpf_level.filter_level_u = cpi_->common.lf.filter_level_u;
  lpf_level.filter_level_v = cpi_->common.lf.filter_level_v;
  return lpf_level;
}